

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

void __thiscall Connection::~Connection(Connection *this)

{
  if (this->connected == true) {
    disconnect(this);
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->buf_fc_).super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->buf_cf_).super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

Connection::~Connection() {
    if (connected) {
        disconnect();
    }
}